

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  uint uVar1;
  Message ss;
  bool bVar2;
  Message *pMVar3;
  uint uVar4;
  bool bVar5;
  char *pcVar6;
  Message buffer;
  string local_80;
  string error_message;
  Message m;
  
  if (this->spawned_ != true) {
    return false;
  }
  GetCapturedStderr_abi_cxx11_();
  Message::Message(&buffer);
  std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10),"Death test: ");
  local_80._M_dataplus._M_p = this->statement_;
  pMVar3 = Message::operator<<(&buffer,(char **)&local_80);
  Message::operator<<(pMVar3,(char (*) [2])0x13f60a);
  switch(this->outcome_) {
  case DIED:
    if (status_ok) {
      bVar2 = RE::PartialMatch(error_message._M_dataplus._M_p,this->regex_);
      bVar5 = true;
      if (bVar2) goto LAB_0013260f;
      std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10),
                      "    Result: died but not with expected error.\n");
      std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10),"  Expected: ");
      m.ss_.ptr_ = *(scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this->regex_;
      pMVar3 = Message::operator<<(&buffer,(char **)&m);
      pMVar3 = Message::operator<<(pMVar3,(char (*) [2])0x13f60a);
      pMVar3 = Message::operator<<(pMVar3,(char (*) [13])"Actual msg:\n");
      FormatDeathTestOutput(&local_80,&error_message);
      Message::operator<<(pMVar3,&local_80);
    }
    else {
      std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10),
                      "    Result: died but not with expected exit code:\n");
      std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10),"            ");
      uVar1 = this->status_;
      Message::Message(&m);
      ss = m;
      uVar4 = uVar1 & 0x7f;
      if (uVar4 == 0) {
        std::operator<<((ostream *)((long)m.ss_.ptr_ + 0x10),"Exited with exit status ");
        uVar4 = uVar1 >> 8 & 0xff;
LAB_001326dd:
        std::ostream::operator<<((void *)((long)ss.ss_.ptr_ + 0x10),uVar4);
      }
      else if (0x1ffffff < (int)(uVar4 * 0x1000000 + 0x1000000)) {
        std::operator<<((ostream *)((long)m.ss_.ptr_ + 0x10),"Terminated by signal ");
        goto LAB_001326dd;
      }
      if ((char)uVar1 < '\0') {
        std::operator<<((ostream *)((long)ss.ss_.ptr_ + 0x10)," (core dumped)");
      }
      StringStreamToString(&local_80,(stringstream *)ss.ss_.ptr_);
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&m.ss_);
      std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10),(string *)&local_80);
      std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10),"\n");
      std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10),"Actual msg:\n");
      FormatDeathTestOutput((string *)&m,&error_message);
      std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10),(string *)&m);
      std::__cxx11::string::_M_dispose();
    }
    goto LAB_001325cf;
  case LIVED:
    pcVar6 = "    Result: failed to die.\n";
    break;
  case RETURNED:
    pcVar6 = "    Result: illegal return in test statement.\n";
    break;
  case THREW:
    pcVar6 = "    Result: threw an exception.\n";
    break;
  default:
    GTestLog::GTestLog((GTestLog *)&local_80,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/third_party/gtest/googletest/src/gtest-death-test.cc"
                       ,0x248);
    std::operator<<((ostream *)&std::cerr,
                    "DeathTest::Passed somehow called before conclusion of test");
    GTestLog::~GTestLog((GTestLog *)&local_80);
    goto LAB_0013260d;
  }
  std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10),pcVar6);
  std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10)," Error msg:\n");
  FormatDeathTestOutput(&local_80,&error_message);
  std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10),(string *)&local_80);
LAB_001325cf:
  std::__cxx11::string::_M_dispose();
LAB_0013260d:
  bVar5 = false;
LAB_0013260f:
  StringStreamToString(&local_80,(stringstream *)buffer.ss_.ptr_);
  DeathTest::set_last_death_test_message(&local_80);
  std::__cxx11::string::_M_dispose();
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&buffer.ss_);
  std::__cxx11::string::_M_dispose();
  return bVar5;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned())
    return false;

  const std::string error_message = GetCapturedStderr();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
# if GTEST_USES_PCRE
        // PCRE regexes support embedded NULs.
        // GTEST_USES_PCRE is defined only in google3 mode
        const bool matched = RE::PartialMatch(error_message, *regex());
# else
        const bool matched = RE::PartialMatch(error_message.c_str(), *regex());
# endif  // GTEST_USES_PCRE
        if (matched) {
          success = true;
        } else {
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << regex()->pattern() << "\n"
                 << "Actual msg:\n" << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n" << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}